

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_typeSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t slotIndex;
  sysbvm_tuple_t sVar1;
  sysbvm_context_t *context_00;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  context_00 = (sysbvm_context_t *)arguments[1];
  if (context_00 == (sysbvm_context_t *)0x0 || ((ulong)context_00 & 0xf) != 0) {
    sysbvm_error_nullArgument();
    context_00 = (sysbvm_context_t *)arguments[1];
  }
  sVar1 = *arguments;
  slotIndex = sysbvm_typeSlot_getIndex((sysbvm_tuple_t)context_00);
  sVar1 = sysbvm_tuple_slotAt(context_00,sVar1,slotIndex);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_typeSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[1])) sysbvm_error_nullArgument();

    return sysbvm_tuple_slotAt(context, arguments[0], sysbvm_typeSlot_getIndex(arguments[1]));
}